

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

void iDynTree::assertWoAbort(char *semCheck,char *file,char *func,int line)

{
  size_t sVar1;
  ostream *poVar2;
  
  if (file == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x161250);
  }
  else {
    sVar1 = strlen(file);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,file,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
  if (func == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x161250);
  }
  else {
    sVar1 = strlen(func);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,func,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": Failed assertion \'",0x14);
  if (semCheck == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar1 = strlen(semCheck);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,semCheck,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'.\n",3);
  return;
}

Assistant:

void assertWoAbort(const char* semCheck, const char* file, const char* func, int line)
    {
        std::cerr << file << ": " << func << ": " << line << ": Failed assertion '" << semCheck << "'.\n";
    }